

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_insert(nn_hash *self,uint32_t key,nn_hash_item *item)

{
  uint32_t uVar1;
  nn_hash *pnVar2;
  nn_hash *pnVar3;
  nn_list_item *it_00;
  uint uVar4;
  uint32_t *in_RDX;
  uint32_t in_ESI;
  uint *in_RDI;
  bool bVar5;
  uint32_t i;
  nn_list_item *it;
  nn_list_item *in_stack_ffffffffffffffa8;
  nn_list *in_stack_ffffffffffffffb0;
  nn_list_item *item_00;
  undefined7 in_stack_ffffffffffffffc0;
  undefined1 in_stack_ffffffffffffffc7;
  nn_list **local_38;
  nn_hash *self_00;
  
  uVar1 = nn_hash_key(in_ESI);
  uVar4 = uVar1 % *in_RDI;
  pnVar2 = (nn_hash *)nn_list_begin((nn_list *)(*(long *)(in_RDI + 2) + (ulong)uVar4 * 0x10));
  while( true ) {
    self_00 = pnVar2;
    pnVar3 = (nn_hash *)nn_list_end((nn_list *)(*(long *)(in_RDI + 2) + (ulong)uVar4 * 0x10));
    if (pnVar2 == pnVar3) {
      *in_RDX = in_ESI;
      it_00 = (nn_list_item *)(*(long *)(in_RDI + 2) + (ulong)uVar4 * 0x10);
      item_00 = (nn_list_item *)(in_RDX + 2);
      nn_list_end((nn_list *)(*(long *)(in_RDI + 2) + (ulong)uVar4 * 0x10));
      nn_list_insert((nn_list *)CONCAT17(in_stack_ffffffffffffffc7,in_stack_ffffffffffffffc0),
                     item_00,it_00);
      in_RDI[1] = in_RDI[1] + 1;
      bVar5 = false;
      if (*in_RDI < in_RDI[1] << 1) {
        bVar5 = *in_RDI < 0x80000000;
      }
      if (bVar5) {
        nn_hash_rehash(self_00);
      }
      return;
    }
    if (self_00 == (nn_hash *)0x0) {
      local_38 = (nn_list **)0x0;
    }
    else {
      local_38 = &self_00[-1].array;
    }
    if (*(uint32_t *)local_38 == in_ESI) break;
    pnVar2 = (nn_hash *)nn_list_next(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  nn_backtrace_print();
  fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
          "nn_cont (it, struct nn_hash_item, list)->key != key",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/hash.c"
          ,0x65);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

void nn_hash_insert (struct nn_hash *self, uint32_t key,
    struct nn_hash_item *item)
{
    struct nn_list_item *it;
    uint32_t i;

    i = nn_hash_key (key) % self->slots;

    for (it = nn_list_begin (&self->array [i]);
          it != nn_list_end (&self->array [i]);
          it = nn_list_next (&self->array [i], it))
        nn_assert (nn_cont (it, struct nn_hash_item, list)->key != key);

    item->key = key;
    nn_list_insert (&self->array [i], &item->list,
        nn_list_end (&self->array [i]));
    ++self->items;

    /*  If the hash is getting full, double the amount of slots and
        re-hash all the items. */
    if (nn_slow (self->items * 2 > self->slots && self->slots < 0x80000000))
    nn_hash_rehash(self);
}